

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

Raster * rw::xbox_to_d3d(Raster *ras)

{
  int iVar1;
  int iVar2;
  int32 numLevels_00;
  uint8 *texels;
  uint8 *srcpx;
  int i;
  int numLevels;
  Raster *newras;
  XboxRaster *xboxras;
  int dxt;
  Raster *ras_local;
  
  iVar2 = xbox::nativeRasterOffset;
  xboxras._4_4_ = 0;
  if ((*(byte *)((long)&ras->height + (long)xbox::nativeRasterOffset + 1) & 1) != 0) {
    iVar1 = *(int *)((long)&ras->format + (long)xbox::nativeRasterOffset);
    if (iVar1 == 0xc) {
      xboxras._4_4_ = 1;
    }
    else if (iVar1 == 0xe) {
      xboxras._4_4_ = 3;
    }
    else if (iVar1 == 0xf) {
      xboxras._4_4_ = 5;
    }
  }
  if (xboxras._4_4_ == 0) {
    ras_local = (Raster *)0x0;
  }
  else {
    ras_local = Raster::create(ras->width,ras->height,ras->depth,ras->format | 0x84,0);
    numLevels_00 = Raster::getNumLevels(ras);
    d3d::allocateDXT(ras_local,xboxras._4_4_,numLevels_00,
                     (uint)(*(byte *)((long)&ras->height + (long)iVar2) & 1));
    for (srcpx._0_4_ = 0; (int)srcpx < numLevels_00; srcpx._0_4_ = (int)srcpx + 1) {
      texels = Raster::lock(ras,(int)srcpx,2);
      d3d::setTexels(ras_local,texels,(int)srcpx);
      Raster::unlock(ras,(int)srcpx);
    }
  }
  return ras_local;
}

Assistant:

static rw::Raster*
xbox_to_d3d(rw::Raster *ras)
{
	using namespace rw;

	int dxt = 0;
	xbox::XboxRaster *xboxras = GETXBOXRASTEREXT(ras);
	if(xboxras->customFormat){
		switch(xboxras->format){
		case xbox::D3DFMT_DXT1: dxt = 1; break;
		case xbox::D3DFMT_DXT3: dxt = 3; break;
		case xbox::D3DFMT_DXT5: dxt = 5; break;
		}
	}
	if(dxt == 0)
		return nil;

	Raster *newras = Raster::create(ras->width, ras->height, ras->depth,
		                        ras->format | Raster::TEXTURE | Raster::DONTALLOCATE);
	int numLevels = ras->getNumLevels();
	d3d::allocateDXT(newras, dxt, numLevels, xboxras->hasAlpha);
	for(int i = 0; i < numLevels; i++){
		uint8 *srcpx = ras->lock(i, Raster::LOCKREAD);
	//	uint8 *dstpx = newras->lock(i, Raster::LOCKWRITE | Raster::LOCKNOFETCH);
		d3d::setTexels(newras, srcpx, i);
	//	flipDXT(dxt, dstpx, srcpx, ras->width, ras->height);
		ras->unlock(i);
	//	newras->unlock(i);
	}

	return newras;
}